

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::reportInvalidArguments(ConsoleReporter *this,string *arg)

{
  ostream *poVar1;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Invalid Filter: ",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(arg->_M_dataplus)._M_p,arg->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleReporter::reportInvalidArguments(std::string const &arg) {
                stream << "Invalid Filter: " << arg << std::endl;
            }